

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O2

bool __thiscall
Assimp::SMDImporter::ParseFloat(SMDImporter *this,char *szCurrent,char **szCurrentOut,float *out)

{
  bool bVar1;
  char *pcVar2;
  char *szCurrent_local;
  
  szCurrent_local = szCurrent;
  bVar1 = SkipSpaces<char>(&szCurrent_local);
  if (bVar1) {
    pcVar2 = fast_atoreal_move<float>(szCurrent_local,out,true);
    *szCurrentOut = pcVar2;
  }
  return bVar1;
}

Assistant:

bool SMDImporter::ParseFloat(const char* szCurrent, const char** szCurrentOut, float& out) {
    if(!SkipSpaces(&szCurrent)) {
        return false;
    }

    *szCurrentOut = fast_atoreal_move<float>(szCurrent,out);
    return true;
}